

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O3

void P_InitSectorSpecial(sector_t *sector,int special)

{
  byte *pbVar1;
  ushort uVar2;
  uint uVar3;
  DDoor *pDVar4;
  undefined8 uVar5;
  ushort uVar6;
  short sVar7;
  int iVar8;
  double dx;
  double dy;
  
  uVar2 = sector->special;
  if ((uVar2 >> 10 & 1) != 0) {
    pbVar1 = (byte *)((long)&sector->Flags + 3);
    *pbVar1 = *pbVar1 | 0xc0;
    level.total_secrets = level.total_secrets + 1;
  }
  if ((uVar2 >> 0xb & 1) != 0) {
    *(byte *)&sector->Flags = (byte)sector->Flags | 0x10;
  }
  if ((uVar2 >> 0xc & 1) != 0) {
    *(byte *)&sector->Flags = (byte)sector->Flags | 0x20;
  }
  switch(uVar2 >> 8 & 3) {
  case 1:
    if (sector->damageamount == 0) {
      sector->damageamount = 5;
      iVar8 = 0xa4;
LAB_00453ff9:
      sVar7 = 0;
LAB_00454019:
      sector->damageinterval = 0x20;
      sector->leakydamage = sVar7;
      (sector->damagetype).super_FName.Index = iVar8;
      sector->Flags = sector->Flags & 0xfffff87f;
    }
    break;
  case 2:
    if (sector->damageamount == 0) {
      sector->damageamount = 10;
      iVar8 = 0xc0;
      goto LAB_00453ff9;
    }
    break;
  case 3:
    if (sector->damageamount == 0) {
      sector->damageamount = 0x14;
      iVar8 = 0xc0;
      sVar7 = 5;
      goto LAB_00454019;
    }
  }
  sector->special = uVar2 & 0xff;
  P_SpawnLights(sector);
  uVar2 = sector->special;
  if (0x67 < uVar2) {
    if (0x73 < uVar2) {
      if (uVar2 < 0xc4) {
        if (uVar2 == 0x74) {
          if (sector->damageamount != 0) goto LAB_004543c4;
          sector->damageinterval = 0x20;
          sector->leakydamage = 0;
          uVar5 = 0x4000000c0;
LAB_004543a7:
          sector->damagetype = (FNameNoInit)(int)uVar5;
          sector->damageamount = (int)((ulong)uVar5 >> 0x20);
          uVar3 = sector->Flags & 0xfffff87f | 0x400;
          goto LAB_004543be;
        }
        if (uVar2 == 0xc3) {
          pbVar1 = (byte *)((long)&sector->MoreFlags + 1);
          *pbVar1 = *pbVar1 | 1;
          goto LAB_004543c4;
        }
      }
      else {
        if (uVar2 == 0xc4) {
          if (sector->damageamount != 0) goto LAB_004543c4;
          sector->damageinterval = 0x20;
          sector->leakydamage = 0;
          uVar5 = 0xffffffff00000000;
          goto LAB_00454377;
        }
        if (uVar2 == 200) {
          sector->sky = 0x40000000;
          goto LAB_004543c4;
        }
      }
      goto switchD_00454071_caseD_46;
    }
    if (uVar2 == 0x68) goto switchD_00454071_caseD_47;
    if (uVar2 == 0x69) {
      if (sector->damageamount != 0) goto LAB_004543c4;
      sector->damageinterval = 0x20;
      sector->leakydamage = 0;
      uVar5 = 0x2000000c0;
      goto LAB_004543a7;
    }
    if (uVar2 != 0x73) goto switchD_00454071_caseD_46;
    if (sector->damageamount != 0) goto LAB_004543c4;
    sector->damageinterval = 1;
    sector->leakydamage = 0x100;
    uVar5 = 0xf4240000000cb;
    goto LAB_00454377;
  }
  switch(uVar2) {
  case 0x44:
  case 0x50:
    if (sector->damageamount != 0) goto LAB_004543c4;
    sector->damageinterval = 0x20;
    sector->leakydamage = 5;
    uVar5 = 0x14000000c0;
    break;
  case 0x45:
    if (sector->damageamount != 0) goto LAB_004543c4;
    sector->damageinterval = 0x20;
    sector->leakydamage = 0;
    uVar5 = 0xa000000c0;
    break;
  default:
switchD_00454071_caseD_46:
    uVar6 = uVar2 - 0xc9;
    if (uVar6 < 0x18) {
      dx = (double)(int)P_InitSectorSpecial::hexenScrollies[uVar6][0] * 0.5;
      dy = (double)(int)P_InitSectorSpecial::hexenScrollies[uVar6][1] * 0.5;
      iVar8 = (int)((ulong)((long)sector - (long)sectors) >> 3);
      goto LAB_00454420;
    }
    uVar3 = uVar2 - 0xe1;
    if (4 < (ushort)uVar3) {
      return;
    }
    dx = (double)(((ulong)uVar3 << 0x34) + -0x4020000000000000);
    iVar8 = (int)((ulong)((long)sector - (long)sectors) >> 3);
    goto LAB_004541a3;
  case 0x47:
switchD_00454071_caseD_47:
    if (sector->damageamount != 0) goto LAB_004543c4;
    sector->damageinterval = 0x20;
    sector->leakydamage = 0;
    uVar5 = 0x5000000c0;
    break;
  case 0x4a:
    pDVar4 = (DDoor *)M_Malloc_Dbg(0x88,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                   ,0x1f9);
    DDoor::DDoor(pDVar4,sector,doorWaitClose,2.0,0,0,0x41a);
    goto LAB_004543c4;
  case 0x4b:
    if (sector->damageamount != 0) goto LAB_004543c4;
    sector->damageinterval = 0x20;
    sector->leakydamage = 0x100;
    sector->damagetype = (FName)0x0;
    sector->damageamount = 0x14;
    uVar3 = sector->Flags & 0xfffff87f | 0x300;
    goto LAB_004543be;
  case 0x4e:
    pDVar4 = (DDoor *)M_Malloc_Dbg(0x88,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                   ,0x1f9);
    DDoor::DDoor(pDVar4,sector,doorWaitRaise,2.0,0x96,0,0x2904);
    goto LAB_004543c4;
  case 0x4f:
    sector->friction = 0.97265625;
    sector->movefactor = 0.0094146728515625;
    *(byte *)&sector->Flags = (byte)sector->Flags | 0x10;
    goto LAB_004543c4;
  case 0x52:
    if (sector->damageamount != 0) goto LAB_004543c4;
    sector->damageinterval = 0x20;
    sector->leakydamage = 0x100;
    uVar5 = 0x5000000a4;
    goto LAB_004542da;
  case 0x53:
    if (sector->damageamount != 0) goto LAB_004543c4;
    sector->damageinterval = 0x20;
    sector->leakydamage = 0x100;
    uVar5 = 0x8000000a4;
LAB_004542da:
    sector->damagetype = (FNameNoInit)(int)uVar5;
    sector->damageamount = (int)((ulong)uVar5 >> 0x20);
    uVar3 = sector->Flags & 0xfffff87f | 0x80;
LAB_004543be:
    sector->Flags = uVar3;
    goto LAB_004543c4;
  case 0x54:
    if (sector->damageamount == 0) {
      sector->damageinterval = 0x20;
      sector->leakydamage = 0x100;
      sector->damagetype = (FName)0xa4;
      sector->damageamount = 5;
      sector->Flags = sector->Flags & 0xfffff87f | 0x80;
    }
    iVar8 = (int)((ulong)((long)sector - (long)sectors) >> 3);
    dx = -4.0;
LAB_004541a3:
    dy = 0.0;
LAB_00454420:
    P_CreateScroller(sc_floor,dx,dy,-1,iVar8 * 0x7a44c6b,0,scw_all);
    return;
  case 0x55:
    if (sector->damageamount != 0) goto LAB_004543c4;
    sector->damageinterval = 0x20;
    sector->leakydamage = 0;
    uVar5 = 0x4000000c0;
  }
LAB_00454377:
  sector->damagetype = (FNameNoInit)(int)uVar5;
  sector->damageamount = (int)((ulong)uVar5 >> 0x20);
  sector->Flags = sector->Flags & 0xfffff87f;
LAB_004543c4:
  sector->special = 0;
  return;
}

Assistant:

void P_InitSectorSpecial(sector_t *sector, int special)
{
	// [RH] All secret sectors are marked with a BOOM-ish bitfield
	if (sector->special & SECRET_MASK)
	{
		sector->Flags |= SECF_SECRET | SECF_WASSECRET;
		level.total_secrets++;
	}
	if (sector->special & FRICTION_MASK)
	{
		sector->Flags |= SECF_FRICTION;
	}
	if (sector->special & PUSH_MASK)
	{
		sector->Flags |= SECF_PUSH;
	}
	if ((sector->special & DAMAGE_MASK) == 0x100)
	{
		P_SetupSectorDamage(sector, 5, 32, 0, NAME_Fire, 0);
	}
	else if ((sector->special & DAMAGE_MASK) == 0x200)
	{
		P_SetupSectorDamage(sector, 10, 32, 0, NAME_Slime, 0);
	}
	else if ((sector->special & DAMAGE_MASK) == 0x300)
	{
		P_SetupSectorDamage(sector, 20, 32, 5, NAME_Slime, 0);
	}
	sector->special &= 0xff;

	// [RH] Normal DOOM special or BOOM specialized?
	bool keepspecial = false;
	P_SpawnLights(sector);
	switch (sector->special)
	{
	case dLight_Strobe_Hurt:
		P_SetupSectorDamage(sector, 20, 32, 5, NAME_Slime, 0);
		break;

	case dDamage_Hellslime:
		P_SetupSectorDamage(sector, 10, 32, 0, NAME_Slime, 0);
		break;

	case dDamage_Nukage:
		P_SetupSectorDamage(sector, 5, 32, 0, NAME_Slime, 0);
		break;

	case dSector_DoorCloseIn30:
		new DDoor(sector, DDoor::doorWaitClose, 2, 0, 0, 30 * TICRATE);
		break;
			
	case dDamage_End:
		P_SetupSectorDamage(sector, 20, 32, 256, NAME_None, SECF_ENDGODMODE|SECF_ENDLEVEL);
		break;

	case dSector_DoorRaiseIn5Mins:
		new DDoor (sector, DDoor::doorWaitRaise, 2, TICRATE*30/7, 0, 5*60*TICRATE);
		break;

	case dFriction_Low:
		sector->friction = FRICTION_LOW;
		sector->movefactor = 0x269/65536.;
		sector->Flags |= SECF_FRICTION;
		break;

	case dDamage_SuperHellslime:
		P_SetupSectorDamage(sector, 20, 32, 5, NAME_Slime, 0);
		break;

	case dDamage_LavaWimpy:
		P_SetupSectorDamage(sector, 5, 32, 256, NAME_Fire, SECF_DMGTERRAINFX);
		break;

	case dDamage_LavaHefty:
		P_SetupSectorDamage(sector, 8, 32, 256, NAME_Fire, SECF_DMGTERRAINFX);
		break;

	case dScroll_EastLavaDamage:
		P_SetupSectorDamage(sector, 5, 32, 256, NAME_Fire, SECF_DMGTERRAINFX);
		P_CreateScroller(EScroll::sc_floor, -4., 0, -1, int(sector - sectors), 0);
		keepspecial = true;
		break;

	case hDamage_Sludge:
		P_SetupSectorDamage(sector, 4, 32, 0, NAME_Slime, 0);
		break;

	case sLight_Strobe_Hurt:
		P_SetupSectorDamage(sector, 5, 32, 0, NAME_Slime, 0);
		break;

	case sDamage_Hellslime:
		P_SetupSectorDamage(sector, 2, 32, 0, NAME_Slime, SECF_HAZARD);
		break;

	case Damage_InstantDeath:
		// Strife's instant death sector
		P_SetupSectorDamage(sector, TELEFRAG_DAMAGE, 1, 256, NAME_InstantDeath, 0);
		break;

	case sDamage_SuperHellslime:
		P_SetupSectorDamage(sector, 4, 32, 0, NAME_Slime, SECF_HAZARD);
		break;

	case Sector_Hidden:
		sector->MoreFlags |= SECF_HIDDEN;
		break;

	case Sector_Heal:
		// CoD's healing sector
		P_SetupSectorDamage(sector, -1, 32, 0, NAME_None, 0);
		break;

	case Sky2:
		sector->sky = PL_SKYFLAT;
		break;

	default:
		if (sector->special >= Scroll_North_Slow &&
			sector->special <= Scroll_SouthWest_Fast)
		{ // Hexen scroll special
			static const SBYTE hexenScrollies[24][2] =
			{
				{  0,  1 }, {  0,  2 }, {  0,  4 },
				{ -1,  0 }, { -2,  0 }, { -4,  0 },
				{  0, -1 }, {  0, -2 }, {  0, -4 },
				{  1,  0 }, {  2,  0 }, {  4,  0 },
				{  1,  1 }, {  2,  2 }, {  4,  4 },
				{ -1,  1 }, { -2,  2 }, { -4,  4 },
				{ -1, -1 }, { -2, -2 }, { -4, -4 },
				{  1, -1 }, {  2, -2 }, {  4, -4 }
			};

			
			int i = sector->special - Scroll_North_Slow;
			double dx = hexenScrollies[i][0] / 2.;
			double dy = hexenScrollies[i][1] / 2.;
			P_CreateScroller(EScroll::sc_floor, dx, dy, -1, int(sector-sectors), 0);
		}
		else if (sector->special >= Carry_East5 &&
					sector->special <= Carry_East35)
		{ // Heretic scroll special
			// Only east scrollers also scroll the texture
			P_CreateScroller(EScroll::sc_floor,
				-0.5 * (1 << ((sector->special & 0xff) - Carry_East5)),	0, -1, int(sector-sectors), 0);
		}
		keepspecial = true;
		break;
	}
	if (!keepspecial) sector->special = 0;
}